

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::ElementsAreMatcherImpl<const_phmap::priv::BitMask<unsigned_int,_16,_0>_&>::
MatchAndExplain(ElementsAreMatcherImpl<const_phmap::priv::BitMask<unsigned_int,_16,_0>_&> *this,
               BitMask<unsigned_int,_16,_0> *container,MatchResultListener *listener)

{
  ostream *poVar1;
  pointer pMVar2;
  pointer pbVar3;
  bool bVar4;
  uint uVar5;
  MatchResultListener *pMVar6;
  bool bVar7;
  long lVar8;
  undefined1 uVar9;
  long lVar10;
  size_t sVar11;
  size_t sVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  StringMatchResultListener s;
  uint local_200;
  undefined4 uStack_1fc;
  long local_1f0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  poVar1 = listener->stream_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1e0,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)local_1c8);
  uVar5 = container->mask_;
  if (uVar5 == 0) {
    sVar11 = 0;
    uVar9 = false;
    sVar12 = sVar11;
  }
  else {
    lVar8 = 0;
    lVar10 = 0;
    sVar11 = 0;
    do {
      uVar9 = false;
      pMVar2 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar12 = sVar11;
      if (sVar11 == ((long)(this->matchers_).
                           super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 3) *
                    -0x5555555555555555) break;
      if (poVar1 == (ostream *)0x0) {
        local_200 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> local_200 & 1) == 0; local_200 = local_200 + 1) {
          }
        }
        local_1c8._8_8_ = (ostream *)0x0;
        local_1c8._0_8_ = &PTR__MatchResultListener_001bc270;
        bVar4 = MatcherBase<const_int_&>::MatchAndExplain
                          ((MatcherBase<const_int_&> *)
                           ((long)&(pMVar2->super_MatcherBase<const_int_&>).
                                   super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                           lVar10),(int *)&local_200,(MatchResultListener *)local_1c8);
      }
      else {
        local_1c8._8_8_ = local_1a8;
        local_1c8._0_8_ = &PTR__StringMatchResultListener_001bc2d8;
        std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 0x10));
        local_200 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> local_200 & 1) == 0; local_200 = local_200 + 1) {
          }
        }
        bVar4 = MatcherBase<const_int_&>::MatchAndExplain
                          ((MatcherBase<const_int_&> *)
                           ((long)&(((this->matchers_).
                                     super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_MatcherBase<const_int_&>).super_MatcherDescriberInterface.
                                   _vptr_MatcherDescriberInterface + lVar10),(int *)&local_200,
                           (MatchResultListener *)local_1c8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)&((local_1e0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8),
                   (string *)&local_200);
        if ((long *)CONCAT44(uStack_1fc,local_200) != local_1f0) {
          operator_delete((long *)CONCAT44(uStack_1fc,local_200),local_1f0[0] + 1);
        }
        local_1c8._0_8_ = &PTR__StringMatchResultListener_001bc2d8;
        std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 0x10));
        std::ios_base::~ios_base(local_138);
      }
      uVar9 = false;
      if (bVar4 == false) {
        uVar9 = true;
        break;
      }
      sVar11 = sVar11 + 1;
      lVar10 = lVar10 + 0x18;
      lVar8 = lVar8 + 0x20;
      uVar5 = uVar5 - 1 & uVar5;
      sVar12 = sVar11;
    } while (uVar5 != 0);
  }
  for (; uVar5 != 0; uVar5 = uVar5 - 1 & uVar5) {
    sVar11 = sVar11 + 1;
  }
  if (sVar11 == ((long)(this->matchers_).
                       super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->matchers_).
                       super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
    if (!(bool)uVar9) {
      bVar4 = true;
      if ((poVar1 != (ostream *)0x0) &&
         ((this->matchers_).
          super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->matchers_).
          super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        lVar10 = 8;
        bVar7 = false;
        lVar8 = 0;
        do {
          pbVar3 = local_1e0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (*(long *)((long)&((local_1e0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar10) != 0) {
            if (bVar7) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar6 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            if (pMVar6->stream_ != (ostream *)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)pMVar6->stream_);
            }
            pMVar6 = MatchResultListener::operator<<(pMVar6,(char (*) [11])" matches, ");
            bVar7 = true;
            if (pMVar6->stream_ != (ostream *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (pMVar6->stream_,*(char **)((long)pbVar3 + lVar10 + -8),
                         *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar10));
            }
          }
          lVar8 = lVar8 + 1;
          lVar10 = lVar10 + 0x20;
        } while (lVar8 != ((long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555);
      }
      goto LAB_00146333;
    }
    if (poVar1 != (ostream *)0x0) {
      uVar5 = container->mask_;
      for (sVar11 = sVar12; sVar11 != 0; sVar11 = sVar11 - 1) {
        uVar5 = uVar5 - 1 & uVar5;
      }
      pMVar6 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      if (pMVar6->stream_ != (ostream *)0x0) {
        std::ostream::_M_insert<unsigned_long>((ulong)pMVar6->stream_);
      }
      pMVar6 = MatchResultListener::operator<<(pMVar6,(char (*) [3])0x18fb53);
      local_200 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> local_200 & 1) == 0; local_200 = local_200 + 1) {
        }
      }
      PrintToString<unsigned_int>((string *)local_1c8,&local_200);
      if (pMVar6->stream_ != (ostream *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (pMVar6->stream_,(char *)local_1c8._0_8_,local_1c8._8_8_);
      }
      MatchResultListener::operator<<(pMVar6,(char (*) [3])") ");
      if (local_1c8._0_8_ != (long)local_1c8 + 0x10) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
      }
      MatcherBase<const_int_&>::DescribeNegationTo
                (&(this->matchers_).
                  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar12].super_MatcherBase<const_int_&>,
                 listener->stream_);
      poVar1 = listener->stream_;
      bVar4 = false;
      if ((poVar1 == (ostream *)0x0) ||
         (bVar4 = false,
         local_1e0.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[sVar12]._M_string_length == 0))
      goto LAB_00146333;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_1e0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[sVar12]._M_dataplus._M_p,
                 local_1e0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[sVar12]._M_string_length);
    }
  }
  else {
    bVar4 = false;
    if ((poVar1 == (ostream *)0x0) || (sVar11 == 0)) goto LAB_00146333;
    pMVar6 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
    Elements((ElementsAreMatcherImpl<const_phmap::priv::BitMask<unsigned_int,_16,_0>_&> *)local_1c8,
             sVar11);
    MatchResultListener::operator<<(pMVar6,(Message *)local_1c8);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_1c8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_1c8._0_8_ + 8))();
    }
  }
  bVar4 = false;
LAB_00146333:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e0);
  return bVar4;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    auto it = stl_container.begin();
    size_t exam_pos = 0;
    bool unmatched_found = false;

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        unmatched_found = true;
        // We cannot store the iterator for the unmatched element to be used
        // later, as some users use ElementsAre() with a "container" whose
        // iterator is not copy-constructible or copy-assignable.
        //
        // We cannot store a pointer to the element either, as some container's
        // iterators return a temporary.
        //
        // We cannot store the element itself either, as the element may not be
        // copyable.
        //
        // Therefore, we just remember the index of the unmatched element,
        // and use it later to print the unmatched element.
        break;
      }
    }
    // If unmatched_found is true, exam_pos is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (unmatched_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        // Find the unmatched element.
        auto unmatched_it = stl_container.begin();
        // We cannot call std::advance() on the iterator, as some users use
        // ElementsAre() with a "container" whose iterator is incompatible with
        // std::advance() (e.g. it may not have the difference_type member
        // type).
        for (size_t i = 0; i != exam_pos; ++i) {
          ++unmatched_it;
        }

        // If the array is long or the elements' print-out is large, it may be
        // hard for the user to find the mismatched element and its
        // corresponding matcher description. Therefore we print the index, the
        // value of the mismatched element, and the corresponding matcher
        // description to ease debugging.
        *listener << "whose element #" << exam_pos << " ("
                  << PrintToString(*unmatched_it) << ") ";
        matchers_[exam_pos].DescribeNegationTo(listener->stream());
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }